

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QPixmapStyleDescriptor * __thiscall
QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
          (QPixmapStyleDescriptor *__return_storage_ptr__,
          QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *this,
          ControlDescriptor *key)

{
  QPixmapStyleDescriptor *pQVar1;
  
  pQVar1 = valueImpl<QPixmapStyle::ControlDescriptor>(this,key);
  if (pQVar1 == (QPixmapStyleDescriptor *)0x0) {
    (__return_storage_ptr__->fileName).d.d = (Data *)0x0;
    (__return_storage_ptr__->fileName).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->fileName).d.size = 0;
    (__return_storage_ptr__->size).wd = -1;
    (__return_storage_ptr__->size).ht = -1;
    (__return_storage_ptr__->margins).m_left = 0;
    (__return_storage_ptr__->margins).m_top = 0;
    (__return_storage_ptr__->margins).m_right = 0;
    (__return_storage_ptr__->margins).m_bottom = 0;
    (__return_storage_ptr__->tileRules).horizontal = StretchTile;
    (__return_storage_ptr__->tileRules).vertical = StretchTile;
  }
  else {
    QPixmapStyleDescriptor::QPixmapStyleDescriptor(__return_storage_ptr__,pQVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }